

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

int kvtree_unset_kv(kvtree *hash,char *key,char *val)

{
  kvtree_elem *pkVar1;
  kvtree_struct *hash_00;
  
  if (hash != (kvtree *)0x0) {
    pkVar1 = kvtree_elem_get(hash,key);
    if (pkVar1 == (kvtree_elem *)0x0) {
      hash_00 = (kvtree *)0x0;
    }
    else {
      hash_00 = pkVar1->hash;
    }
    kvtree_unset(hash_00,val);
    if ((hash_00 == (kvtree *)0x0) || (hash_00->lh_first == (kvtree_elem_struct *)0x0)) {
      kvtree_unset(hash,key);
    }
  }
  return 0;
}

Assistant:

int kvtree_unset_kv(kvtree* hash, const char* key, const char* val)
{
  if (hash == NULL) {
    return KVTREE_SUCCESS;
  }

  kvtree* v = kvtree_get(hash, key);
  int rc = kvtree_unset(v, val);
  if (kvtree_size(v) == 0) {
    rc = kvtree_unset(hash, key);
  }

  return rc;
}